

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readgamma.hpp
# Opt level: O2

vector<TensorEntry,_std::allocator<TensorEntry>_> *
readGamma(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,int n)

{
  int iVar1;
  istream *piVar2;
  TensorEntry entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string line;
  ifstream sparsefile;
  
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::to_string((string *)&tokens,n);
  std::operator+(&local_278,"../gamma/sparse",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokens);
  std::ifstream::ifstream(&sparsefile,(string *)&local_278,_S_in);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&tokens);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&sparsefile,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::substr((ulong)&local_278,(ulong)&line);
    split(&tokens,&local_278,',');
    std::__cxx11::string::~string((string *)&local_278);
    iVar1 = std::__cxx11::stoi(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
    entry.a = (short)iVar1;
    iVar1 = std::__cxx11::stoi(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
    entry.b = (short)iVar1;
    iVar1 = std::__cxx11::stoi(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
    entry.c = (short)iVar1;
    entry.val = std::__cxx11::stof(tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0);
    std::vector<TensorEntry,_std::allocator<TensorEntry>_>::push_back(__return_storage_ptr__,&entry)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokens);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&sparsefile);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<TensorEntry> readGamma(int n)
{
    std::vector<TensorEntry> sparsegamma;
    std::string line;
    std::ifstream sparsefile("../gamma/sparse" + std::to_string(n));
    TensorEntry entry;
    while(getline(sparsefile, line))
    {
        std::vector<std::string> tokens = split(line.substr(1, line.length() - 3), ',');
        entry.a = std::stoi(tokens[0]);
        entry.b = std::stoi(tokens[1]);
        entry.c = std::stoi(tokens[2]);
        entry.val = std::stof(tokens[3]);
        sparsegamma.push_back(entry);
    }
    sparsefile.close();
    return sparsegamma;
}